

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata256.cpp
# Opt level: O2

void __thiscall
ByteData256_EqualsMatch_Test::~ByteData256_EqualsMatch_Test(ByteData256_EqualsMatch_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ByteData256, EqualsMatch) {
  ByteData256 byte_data1 = ByteData256(
      "1234567890123456789012345678901234567890123456789012345678901234");
  ByteData256 byte_data2 = ByteData256(
      "1234567890123456789012345678901234567890123456789012345678901234");
  bool is_equals = byte_data1.Equals(byte_data2);

  EXPECT_TRUE(is_equals);
}